

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.h
# Opt level: O0

void __thiscall
Js::StringProfiler::StringMetrics::Accumulate(StringMetrics *this,RequiredEncoding encoding)

{
  RequiredEncoding encoding_local;
  StringMetrics *this_local;
  
  if (encoding == ASCII7bit) {
    this->count7BitASCII = this->count7BitASCII + 1;
  }
  else if (encoding == ASCII8bit) {
    this->count8BitASCII = this->count8BitASCII + 1;
  }
  else if (encoding == Unicode16bit) {
    this->countUnicode = this->countUnicode + 1;
  }
  return;
}

Assistant:

void Accumulate( RequiredEncoding encoding )
            {
                switch(encoding)
                {
                case ASCII7bit:
                    this->count7BitASCII++;
                    break;
                case ASCII8bit:
                    this->count8BitASCII++;
                    break;
                case Unicode16bit:
                    this->countUnicode++;
                    break;
                }
            }